

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsByFrequency
          (MidiMessage *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping,
          int program)

{
  pointer ppVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> semimap;
  allocator_type local_41;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&local_40,
             (long)(mapping->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(mapping->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,&local_41);
  ppVar1 = (mapping->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(mapping->
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 4)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      *(undefined4 *)
       ((long)&(local_40.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + lVar2) =
           *(undefined4 *)((long)&ppVar1->first + lVar2);
      dVar4 = *(double *)((long)&ppVar1->second + lVar2);
      uVar6 = 0;
      if (1.0 <= dVar4) {
        dVar4 = log2(dVar4 / 440.0);
        dVar5 = dVar4 * 12.0 + 69.0;
        dVar4 = 0.0;
        if (0.0 <= dVar5) {
          dVar4 = dVar5;
        }
        uVar6 = ~-(ulong)(dVar5 < 128.0) & 0x405fc00000000000 |
                (ulong)dVar4 & -(ulong)(dVar5 < 128.0);
      }
      *(ulong *)((long)&(local_40.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second + lVar2) = uVar6;
      lVar3 = lVar3 + 1;
      ppVar1 = (mapping->
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < (int)((ulong)((long)(mapping->
                                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1)
                          >> 4));
  }
  makeMts2_KeyTuningsBySemitone(this,&local_40,program);
  if (local_40.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsByFrequency(std::vector<std::pair<int, double>>& mapping, int program) {
	std::vector<std::pair<int, double>> semimap(mapping.size());
	for (int i=0; i<(int)mapping.size(); i++) {
		semimap[i].first = mapping[i].first;
		semimap[i].second = MidiMessage::frequencyToSemitones(mapping[i].second);
	}
	this->makeMts2_KeyTuningsBySemitone(semimap, program);
}